

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patomic-sync.c
# Opt level: O2

void p_atomic_int_set(pint *atomic,pint val)

{
  *atomic = val;
  return;
}

Assistant:

P_LIB_API void
p_atomic_int_set (volatile pint	*atomic,
		  pint		val)
{
	*atomic = val;
#ifdef P_CC_CRAY
	__builtin_ia32_mfence ();
#else
	__sync_synchronize ();
#endif
}